

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::TestCase1772::run::MockEventPort::poll
          (MockEventPort *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_40;
  undefined1 local_29;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_28;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f1791;
  MockEventPort *pMStack_10;
  char c;
  MockEventPort *this_local;
  
  this->pollStack = (char *)((long)&_f1791 + 7);
  pMStack_10 = this;
  local_28 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>(&this->fulfiller);
  if (local_28 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
    f = local_28;
    pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_28);
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_29);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              (&this->fulfiller,&local_40);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_40);
  }
  return 0;
}

Assistant:

bool poll() override {
      char c;
      pollStack = &c;
      KJ_IF_SOME(f, fulfiller) {
        f->fulfill();
        fulfiller = kj::none;
      }
      return false;
    }